

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O0

reference __thiscall
OpenMesh::BaseKernel::property<OpenMesh::Attributes::StatusInfo>
          (BaseKernel *this,HPropHandleT<OpenMesh::Attributes::StatusInfo> _ph,HalfedgeHandle _hh)

{
  int _idx;
  PropertyT<OpenMesh::Attributes::StatusInfo> *this_00;
  reference pvVar1;
  BaseKernel *this_local;
  HalfedgeHandle _hh_local;
  HPropHandleT<OpenMesh::Attributes::StatusInfo> _ph_local;
  
  this_local._0_4_ = _hh.super_BaseHandle.idx_;
  this_local._4_4_ =
       (int)_ph.super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.idx_;
  this_00 = PropertyContainer::property<OpenMesh::Attributes::StatusInfo>
                      (&this->hprops_,
                       _ph.super_BasePropHandleT<OpenMesh::Attributes::StatusInfo>.super_BaseHandle.
                       idx_);
  _idx = BaseHandle::idx((BaseHandle *)&this_local);
  pvVar1 = PropertyT<OpenMesh::Attributes::StatusInfo>::operator[](this_00,_idx);
  return pvVar1;
}

Assistant:

typename HPropHandleT<T>::reference
  property(HPropHandleT<T> _ph, HalfedgeHandle _hh) {
    return hprops_.property(_ph)[_hh.idx()];
  }